

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastaTest_CompressedParseWhole_Test::
~BioparserFastaTest_CompressedParseWhole_Test(BioparserFastaTest_CompressedParseWhole_Test *this)

{
  BioparserFastaTest_CompressedParseWhole_Test *this_local;
  
  ~BioparserFastaTest_CompressedParseWhole_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedParseWhole) {
  Setup("sample.fasta.gz");
  s = p->Parse(-1);
  Check();
}